

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

mz_bool (anonymous_namespace)::miniz::mz_zip_writer_write_zeros
                  (mz_zip_archive *pZip,mz_uint64 cur_file_ofs,mz_uint32 n)

{
  size_t sVar1;
  size_t __n;
  size_t sVar2;
  char buf [4096];
  
  __n = 0x1000;
  if (n < 0x1000) {
    __n = (size_t)n;
  }
  memset(buf,0,__n);
  do {
    if (n == 0) {
      return 1;
    }
    sVar2 = 0x1000;
    if (n < 0x1000) {
      sVar2 = (size_t)n;
    }
    sVar1 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,cur_file_ofs,buf,sVar2);
    cur_file_ofs = cur_file_ofs + sVar2;
    n = n - (int)sVar2;
  } while (sVar1 == sVar2);
  return 0;
}

Assistant:

static mz_bool mz_zip_writer_write_zeros(mz_zip_archive *pZip,
                                         mz_uint64 cur_file_ofs, mz_uint32 n) {
  char buf[4096];
  memset(buf, 0, MZ_MIN(sizeof(buf), n));
  while (n) {
    mz_uint32 s = MZ_MIN(sizeof(buf), n);
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_file_ofs, buf, s) != s)
      return MZ_FALSE;
    cur_file_ofs += s;
    n -= s;
  }
  return MZ_TRUE;
}